

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void recff_cdata_call(jit_State *J,RecordFFData *rd)

{
  CTSize *pCVar1;
  TRef *pTVar2;
  CTState *cts;
  CTState *cts_00;
  CType *pCVar3;
  TRef *pTVar4;
  lua_State *plVar5;
  BCIns *pBVar6;
  BCIns *pBVar7;
  TValue *pTVar8;
  TRef TVar9;
  uint uVar10;
  CTInfo CVar11;
  IRType IVar12;
  TRef TVar13;
  uint uVar14;
  GCcdata *pGVar15;
  cTValue *pcVar16;
  uint64_t uVar17;
  long lVar18;
  short sVar19;
  IRRef1 IVar20;
  CType *pCVar21;
  ushort uVar22;
  MMS mm;
  uint id;
  TValue *pTVar23;
  ulong uVar24;
  lua_State *L;
  long lVar25;
  TValue *base;
  ulong uVar26;
  bool bVar27;
  IRRef1 local_e0;
  CType *local_d8;
  cTValue local_c0;
  TRef local_b8;
  TRef aTStack_b4 [33];
  
  cts = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  pGVar15 = argv2cdata(J,*J->base,rd->argv);
  uVar22 = pGVar15->ctypeid;
  uVar14 = (uint)uVar22;
  if (uVar14 == 0x16) {
    uVar14 = (uint)pGVar15[1].nextgc.gcptr64;
    crec_constructor(J,(GCcdata *)(ulong)uVar14,*J->base);
    mm = MM_new;
LAB_0015afd7:
    uVar10 = cts->tab[uVar14].info;
    id = uVar10 & 0xffff;
    if ((uVar10 & 0xf0000000) != 0x20000000) {
      id = uVar14;
    }
    pcVar16 = lj_ctype_meta(cts,id,mm);
    if (pcVar16 == (cTValue *)0x0) {
      if (uVar22 == 0x16) {
        crec_alloc(J,rd,uVar14);
        return;
      }
    }
    else if ((pcVar16->field_4).it >> 0xf == 0x1fff7) {
      TVar13 = lj_ir_kgc(J,(GCobj *)((ulong)pcVar16->field_4 & 0x7fffffffffff),IRT_FUNC);
      pTVar4 = J->base;
      pTVar4[-2] = TVar13;
      pTVar4[-1] = 0x10000;
      rd->nres = -1;
      return;
    }
    lj_trace_err(J,LJ_TRERR_BADTYPE);
  }
  cts_00 = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  pCVar3 = cts_00->tab;
  CVar11 = pCVar3[uVar22].info;
  local_d8 = pCVar3 + uVar22;
  if ((CVar11 & 0xf0000000) == 0x20000000) {
    pCVar1 = &local_d8->size;
    uVar10 = CVar11 & 0xffff;
    CVar11 = pCVar3[uVar10].info;
    local_d8 = pCVar3 + uVar10;
    sVar19 = (ushort)(*pCVar1 == 8) * 4 + 5;
  }
  else {
    sVar19 = 9;
  }
  mm = MM_call;
  if ((CVar11 & 0xf0000000) != 0x60000000) goto LAB_0015afd7;
  TVar13 = *J->base;
  (J->fold).ins.field_0.ot = sVar19 + 0x4500;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
  (J->fold).ins.field_0.op2 = 0x15;
  TVar13 = lj_opt_fold(J);
  local_e0 = (IRRef1)TVar13;
  pCVar3 = cts_00->tab + (ushort)local_d8->info;
  IVar12 = crec_ct2irt(cts_00,pCVar3);
  if (sVar19 == 9) {
    uVar17 = pGVar15[1].nextgc.gcptr64;
  }
  else {
    uVar17 = (uint64_t)(uint)pGVar15[1].nextgc.gcptr64;
  }
  local_c0.u64 = uVar17 >> 2;
  pcVar16 = lj_tab_get(J->L,cts_00->miscmap,&local_c0);
  if ((pcVar16->field_4).it >> 0xf == 0x1fffd) {
    lj_trace_err(J,LJ_TRERR_BLACKL);
  }
  uVar14 = pCVar3->info >> 0x1c;
  if (uVar14 == 4) {
    rd->nres = 0;
    IVar12 = IRT_NIL;
  }
  else if (((uVar14 != 2 && 0xfffffff < pCVar3->info) && (uVar14 != 5)) || (IVar12 == IRT_CDATA))
  goto LAB_0015b53f;
  if ((local_d8->info & 0x800000) != 0) {
    TVar13 = lj_ir_kint(J,(int)((ulong)((long)local_d8 - (long)cts_00->tab) >> 3) * -0x55555555);
    (J->fold).ins.field_0.ot = 0x6400;
    (J->fold).ins.field_0.op1 = local_e0;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar13;
    TVar13 = lj_opt_fold(J);
    local_e0 = (IRRef1)TVar13;
  }
  uVar22 = (ushort)IVar12;
  local_b8 = 0x7fff;
  if (J->base[1] == 0) {
LAB_0015b2f5:
    IVar20 = (IRRef1)local_b8;
  }
  else {
    pTVar23 = rd->argv;
    lVar25 = 0;
    uVar24 = (ulong)local_d8->sib;
    pTVar4 = J->base;
    do {
      lVar18 = lVar25;
      if (lVar18 == 0x20) goto LAB_0015b53f;
      pTVar23 = pTVar23 + 1;
      if ((int)uVar24 == 0) {
        if ((local_d8->info & 0x800000) == 0) goto LAB_0015b53f;
        uVar14 = lj_ccall_ctid_vararg(cts_00,pTVar23);
        pCVar21 = cts_00->tab;
        uVar26 = 0;
      }
      else {
        pCVar21 = cts_00->tab;
        uVar26 = (ulong)pCVar21[uVar24].sib;
        uVar14 = (uint)(ushort)pCVar21[uVar24].info;
      }
      if (((0xfffffff < pCVar21[uVar14].info) &&
          (uVar10 = pCVar21[uVar14].info >> 0x1c, uVar10 != 2)) && (uVar10 != 5)) goto LAB_0015b53f;
      pCVar21 = pCVar21 + uVar14;
      TVar13 = crec_ct_tv(J,pCVar21,0,pTVar4[1],pTVar23);
      uVar14 = pCVar21->info;
      if (((uVar14 & 0xf4000000) == 0) && (pCVar21->size < 4)) {
        bVar27 = pCVar21->size != 1;
        (J->fold).ins.field_0.ot = 0x5b13;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
        IVar20 = bVar27 + 0x270 + (ushort)bVar27;
        if ((uVar14 >> 0x17 & 1) == 0) {
          IVar20 = bVar27 + 0xa6f + (ushort)bVar27;
        }
        (J->fold).ins.field_0.op2 = IVar20;
        TVar13 = lj_opt_fold(J);
      }
      aTStack_b4[lVar18 + -1] = TVar13;
      pTVar2 = pTVar4 + 2;
      lVar25 = lVar18 + 1;
      uVar24 = uVar26;
      pTVar4 = pTVar4 + 1;
    } while (*pTVar2 != 0);
    if (lVar18 == 0) goto LAB_0015b2f5;
    lVar25 = 0;
    TVar13 = local_b8;
    do {
      TVar9 = aTStack_b4[lVar25];
      (J->fold).ins.field_0.ot = 0x6400;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
      TVar13 = lj_opt_fold(J);
      IVar20 = (IRRef1)TVar13;
      lVar25 = lVar25 + 1;
    } while (lVar18 != lVar25);
  }
  (J->fold).ins.field_0.ot = uVar22 | 0x6300;
  (J->fold).ins.field_0.op1 = IVar20;
  (J->fold).ins.field_0.op2 = local_e0;
  TVar13 = lj_opt_fold(J);
  IVar20 = (IRRef1)TVar13;
  if ((pCVar3->info & 0xf8000000) == 0x8000000) {
    plVar5 = J->L;
    pTVar23 = plVar5->base;
    pBVar6 = (BCIns *)pTVar23[-1].u64;
    if (((ulong)pBVar6 & 3) != 0) {
LAB_0015b53f:
      lj_trace_err(J,LJ_TRERR_NYICALL);
    }
    uVar14 = pBVar6[-1];
    TVar13 = 0x7fff;
    if ((uVar14 & 0xff000000) != 0x1000000) {
      if (J->framedepth < 1) goto LAB_0015b53f;
      pBVar7 = J->pc;
      pTVar4 = J->base;
      TVar13 = pTVar4[-2];
      pTVar8 = plVar5->top;
      J->pc = pBVar6;
      uVar14 = uVar14 >> 8 & 0xff;
      plVar5->top = pTVar23;
      plVar5->base = (TValue *)((long)pTVar23 - (ulong)(uVar14 * 8 + 0x10));
      pTVar4[-2] = 0x1007ffe;
      uVar24 = (ulong)(uVar14 * 4 + 8);
      J->base = (TRef *)((long)pTVar4 - uVar24);
      J->baseslot = J->baseslot - (uVar14 + 2);
      J->maxslot = uVar14 + 1;
      J->framedepth = J->framedepth + -1;
      lj_snap_add(J);
      plVar5->base = pTVar23;
      plVar5->top = pTVar8;
      J->framedepth = J->framedepth + 1;
      J->maxslot = 1;
      pTVar4 = J->base;
      J->base = (TRef *)((long)pTVar4 + uVar24);
      J->baseslot = J->baseslot + uVar14 + 2;
      *(TRef *)((long)pTVar4 + (uVar24 - 8)) = TVar13;
      J->pc = pBVar7;
      TVar13 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.ot = 0x990;
      (J->fold).ins.field_0.op1 = IVar20;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar13;
      J->postproc = LJ_POST_FIXGUARDSNAP;
      TVar13 = 0x2007ffd;
    }
    goto LAB_0015b4b0;
  }
  if (((IVar12 < IRT_SOFTFP) && ((0x600220U >> (IVar12 & IRT_TYPE) & 1) != 0)) ||
     ((pCVar3->info & 0xf0000000) == 0x50000000)) {
    TVar13 = lj_ir_kint(J,(uint)(ushort)local_d8->info);
    (J->fold).ins.field_0.ot = 0x548a;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
    (J->fold).ins.field_0.op2 = IVar20;
  }
  else {
    switch(IVar12) {
    case IRT_FLOAT:
    case IRT_U32:
      uVar22 = uVar22 | 0x1c0;
      (J->fold).ins.field_0.ot = 0x5b0e;
      goto LAB_0015b516;
    default:
      if ((IVar12 & ~IRT_TRUE) != IRT_U8) goto LAB_0015b4b0;
      uVar22 = uVar22 | 0x260;
      break;
    case IRT_I8:
    case IRT_I16:
      uVar22 = uVar22 | 0xa60;
    }
    (J->fold).ins.field_0.ot = 0x5b13;
LAB_0015b516:
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = uVar22;
  }
  TVar13 = lj_opt_fold(J);
LAB_0015b4b0:
  *J->base = TVar13;
  J->needsnap = '\x01';
  return;
}

Assistant:

void LJ_FASTCALL recff_cdata_call(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  GCcdata *cd = argv2cdata(J, J->base[0], &rd->argv[0]);
  CTypeID id = cd->ctypeid;
  CType *ct;
  cTValue *tv;
  MMS mm = MM_call;
  if (id == CTID_CTYPEID) {
    id = crec_constructor(J, cd, J->base[0]);
    mm = MM_new;
  } else if (crec_call(J, rd, cd)) {
    return;
  }
  /* Record ctype __call/__new metamethod. */
  ct = ctype_raw(cts, id);
  tv = lj_ctype_meta(cts, ctype_isptr(ct->info) ? ctype_cid(ct->info) : id, mm);
  if (tv) {
    if (tvisfunc(tv)) {
      crec_tailcall(J, rd, tv);
      return;
    }
  } else if (mm == MM_new) {
    crec_alloc(J, rd, id);
    return;
  }
  /* No metamethod or NYI: non-function metamethods. */
  lj_trace_err(J, LJ_TRERR_BADTYPE);
}